

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

Status __thiscall
google::protobuf::compiler::java::ValidateNestInFileClassFeature
          (java *this,EnumDescriptor *descriptor)

{
  EnumDescriptor *descriptor_local;
  
  anon_unknown_36::ValidateNestInFileClassFeatureHelper<google::protobuf::EnumDescriptor>
            ((anon_unknown_36 *)this,descriptor);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateNestInFileClassFeature(const EnumDescriptor& descriptor) {
  return ValidateNestInFileClassFeatureHelper(descriptor);
}